

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O2

void __thiscall ExecutorRegVm::Stop(ExecutorRegVm *this,NULLCRef error)

{
  char *dst;
  char *pcVar1;
  NULLCRef ptr;
  nullres nVar2;
  ExternTypeInfo *pEVar3;
  uint in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd4;
  undefined4 local_24;
  
  this->codeRunning = false;
  this->callContinue = false;
  dst = this->execErrorBuffer;
  pcVar1 = (this->exLinker->exSymbols).data;
  pEVar3 = FastVector<ExternTypeInfo,_false,_false>::operator[](this->exTypes,error.typeID);
  NULLC::SafeSprintf(dst,0x10000,"%s",pcVar1 + pEVar3->offsetToName);
  this->execErrorMessage = this->execErrorBuffer;
  nVar2 = nullcIsStackPointer(error.ptr);
  if (nVar2 == '\0') {
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = error.ptr._4_4_;
    in_stack_ffffffffffffffd4 = error._0_8_;
  }
  else {
    ptr.ptr = in_stack_ffffffffffffffd4;
    ptr.typeID = in_stack_ffffffffffffffd0;
    NULLC::CopyObject(ptr);
    *(undefined4 *)((long)&(this->execErrorObject).ptr + 4) = local_24;
  }
  *(char **)&this->execErrorObject = in_stack_ffffffffffffffd4;
  return;
}

Assistant:

void ExecutorRegVm::Stop(NULLCRef error)
{
	codeRunning = false;

	callContinue = false;

	NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "%s", exLinker->exSymbols.data + exTypes[error.typeID].offsetToName);

	execErrorMessage = execErrorBuffer;

	if(nullcIsStackPointer(error.ptr))
		execErrorObject = NULLC::CopyObject(error);
	else
		execErrorObject = error;
}